

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void term_keyinput(Terminal *term,wchar_t codepage,void *str,wchar_t len)

{
  strbuf *buf_o;
  
  if ((L'\xffffffff' < codepage) && (term->ucsdata->line_codepage != codepage)) {
    buf_o = term_input_data_from_charset(term,codepage,(char *)str,len);
    if (buf_o->len != 0) {
      term_keyinput_internal(term,buf_o->s,(wchar_t)buf_o->len,true);
    }
    strbuf_free(buf_o);
    return;
  }
  term_keyinput_internal(term,str,len,true);
  return;
}

Assistant:

void term_keyinput(Terminal *term, int codepage, const void *str, int len)
{
    if (codepage < 0 || codepage == term->ucsdata->line_codepage) {
        /*
         * This text needs no translation, either because it's already
         * in the right character set, or because we got the special
         * codepage value -1 from our caller which means 'this data
         * should be charset-agnostic, just send it raw' (for really
         * simple things like control characters).
         */
        term_keyinput_internal(term, str, len, true);
    } else {
        strbuf *buf = term_input_data_from_charset(term, codepage, str, len);
        if (buf->len)
            term_keyinput_internal(term, buf->s, buf->len, true);
        strbuf_free(buf);
    }
}